

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O2

int __thiscall QGenericItemModel::columnCount(QGenericItemModel *this,QModelIndex *parent)

{
  int iVar1;
  
  iVar1 = QGenericItemModelImplBase::callConst<int,QModelIndex>
                    (*(QGenericItemModelImplBase **)(this + 0x10),ColumnCount,parent);
  return iVar1;
}

Assistant:

int QGenericItemModel::columnCount(const QModelIndex &parent) const
{
    return impl->callConst<int>(QGenericItemModelImplBase::ColumnCount, parent);
}